

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompileTest.cpp
# Opt level: O3

void CompiledMixedType<signed_char,int>(void)

{
  char *t;
  SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>> *this;
  ulong uVar1;
  char cVar2;
  SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> SVar3
  ;
  undefined2 in_AX;
  char ret;
  char ret_1;
  undefined8 uStack_38;
  
  t = (char *)((long)&uStack_38 + 2);
  uStack_38._0_3_ = CONCAT12(1,in_AX);
  uStack_38._0_4_ = (uint)(uint3)uStack_38;
  uStack_38 = CONCAT44(1,(uint)uStack_38);
  DivisionHelper<signed_char,int,5>::
  DivideThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
            (t,(int *)((long)&uStack_38 + 4),(char *)((long)&uStack_38 + 3));
  uVar1 = uStack_38 >> 0x20;
  uStack_38._0_4_ = CONCAT13(1,(uint3)uStack_38);
  uStack_38 = CONCAT44((int)uVar1,(uint)uStack_38) & 0xffffff00ffffffff;
  DivisionHelper<signed_char,signed_char,5>::
  DivideThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
            (t,(char *)((long)&uStack_38 + 3),(char *)((long)&uStack_38 + 4));
  operator/(1,uStack_38._2_1_);
  uStack_38 = CONCAT44(1,(uint)uStack_38);
  DivisionHelper<signed_char,int,5>::
  DivideThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
            (t,(int *)((long)&uStack_38 + 4),t);
  uStack_38 = CONCAT44(1,(uint)uStack_38);
  DivisionHelper<signed_char,int,5>::
  DivideThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
            (t,(int *)((long)&uStack_38 + 4),t);
  if (((0xfffffffffffffeff < (long)uStack_38._2_1_ - 0x7fU) &&
      (0xfffffeff < (int)uStack_38._2_1_ - 0x7fU)) &&
     (cVar2 = uStack_38._2_1_ + '\x01', uStack_38._0_3_ = CONCAT12(cVar2,(ushort)uStack_38),
     0xfffffffffffffeff < (long)cVar2 - 0x7fU)) {
    this = (SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
            *)((long)&uStack_38 + 2);
    uStack_38 = CONCAT53(uStack_38._3_5_,(uint3)(ushort)uStack_38);
    SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
    operator<<(this,1);
    SVar3 = SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
            ::operator<<(this,(SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                               )0x1);
    operator<<(SVar3.m_int,
               (SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
               )0x1);
    SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
    operator<<=(this,1);
    SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
    operator<<=(this,(SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                      )0x1);
    SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
    operator>>(this,1);
    SVar3 = SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
            ::operator>>(this,(SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                               )0x1);
    operator>>(SVar3.m_int,
               (SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
               )0x1);
    SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
    operator>>=(this,1);
    SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
    operator>>=(this,(SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                      )0x1);
    return;
  }
  safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnOverflow();
}

Assistant:

void CompiledMixedType()
{
	// Mixed constructors
	U u = 0;
	T t = 0;
	bool b = false;
	SafeInt<T> st(u);
	SafeInt<U> su(u);
	SafeInt<T> st2(su);

	// Shut up the compiler
	b = !b;

	// Assignment
	st = t;
	st = u;
	st = su;
	st = st2;

	// Casting
	U u2 = (U)st;

	// Multiplication
	t = st * u;
	t = st * st2;
	t = u * st;
	st *= u;
	st *= su;

	// Modulus, modulus assignment
	u = 1;
	st = 1;
	su = 1;
	// For some reason, this is annoying the VS17 link time code generation
//	t = u % st;

	t = st % u;
	st2 = 1;
	t = st % st2;
	st %= u;
	st %= su;

	// Division
	u = 1;
	st2 = 1;
	st = 1;
	t = st / u;
	t = st / st2;
	t = u / st;
	st /= u;
	st /= su;

	// Addition
	t = st + u;
	t = st + st2;
	t = u + st;
	st += u;
	st += su;

	// Subtraction
	st = 0;
	u = 0;
	st2 = 0;
	t = st - u;
	t = st - st2;
	t = u - st;
	st -= u;

	st = 1;
	su = 1;
	st -= su;

	// Shift operators
	u = 1;
	su = 1;
	// Left
	t = st << u;
	t = st << su;
	t = t << su;

	st <<= u;
	st <<= su;

	// Right
	t = st >> u;
	t = st >> su;
	t = t >> su;

	st >>= u;
	st >>= su;

	// Binary operations
	// And
	t = st & st2;
	t = st & u;
	t = t & su;

	st &= st2;
	st &= u;
	st &= su;

	// Or
	t = st | st2;
	t = st | u;
	t = t | su;

	st |= st2;
	st |= u;
	st |= su;

	// Xor
	t = st ^ st2;
	t = st ^ u;
	t = t ^ su;

	st ^= st2;
	st ^= u;
	st ^= su;

	// Comparisons
	// Less than
	b = st < su;
	b = st < u;
	b = u < st;
	b = st < su;

	// Less than or equal
	b = st <= su;
	b = st <= u;
	b = u <= st;
	b = st <= su;

	// Greater than
	b = st > su;
	b = st > u;
	b = u > st;
	b = st > su;

	// Greater than or equal
	b = st >= su;
	b = st >= u;
	b = u >= st;
	b = st >= su;

	// Equals
	b = st == su;
	b = st == u;
	b = u == st;
	b = st == su;
}